

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool IsArith(expr_node *node)

{
  expr_node *node_local;
  bool local_1;
  
  if ((node->type == '\x05') &&
     (((((node->value).integer == 1 || ((node->value).integer == 2)) || ((node->value).integer == 3)
       ) || ((node->value).integer == 4)))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool IsArith(const expr_node* node)
{
    if (
        node->type == OP &&
        (node->value.integer == ADD || node->value.integer == SUB ||
        node->value.integer == MUL || node->value.integer == DIV)
    )
        return true;
    else
        return false;
}